

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.hpp
# Opt level: O0

void __thiscall OpenMD::ForceDecomposition::~ForceDecomposition(ForceDecomposition *this)

{
  undefined8 *in_RDI;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *unaff_retaddr;
  
  *in_RDI = &PTR__ForceDecomposition_004819d8;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::~vector
            ((vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *)unaff_retaddr);
  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  return;
}

Assistant:

virtual ~ForceDecomposition() {}